

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O2

int kget_int32(kstring_t *k,size_t *pos,int32_t *val_p)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  
  sVar8 = *pos;
  uVar3 = k->l;
  while( true ) {
    if (uVar3 <= sVar8) {
      return -1;
    }
    cVar1 = k->s[sVar8];
    if ((cVar1 != ' ') && (cVar1 != '\t')) break;
    sVar8 = sVar8 + 1;
  }
  uVar7 = (cVar1 == '-') + sVar8;
  if (uVar3 <= uVar7) {
    return -1;
  }
  if (9 < (byte)(k->s[sVar8 + (cVar1 == '-')] - 0x30U)) {
    return -1;
  }
  iVar4 = 0;
  for (; (uVar5 = uVar3, uVar7 < uVar3 &&
         (bVar2 = k->s[uVar7], uVar5 = uVar7, (byte)(bVar2 - 0x30) < 10)); uVar7 = uVar7 + 1) {
    iVar4 = iVar4 * 10 + (uint)bVar2 + -0x30;
  }
  *pos = uVar5;
  iVar6 = -iVar4;
  if (cVar1 != '-') {
    iVar6 = iVar4;
  }
  *val_p = iVar6;
  return 0;
}

Assistant:

static int kget_int32(kstring_t *k, size_t *pos, int32_t *val_p) {
    int sign = 1;
    int32_t val = 0;
    size_t p = *pos;

    while (p < k->l && (k->s[p] == ' ' || k->s[p] == '\t'))
	   p++;

    if (p < k->l && k->s[p] == '-')
	sign = -1, p++;

    if (p >= k->l || !(k->s[p] >= '0' && k->s[p] <= '9'))
	return -1;

    while (p < k->l && k->s[p] >= '0' && k->s[p] <= '9')
	val = val*10 + k->s[p++]-'0';
    
    *pos = p;
    *val_p = sign*val;

    return 0;
}